

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::fixedTick(HierarchicalTaskNetworkComponent *this,float dt)

{
  WorldState *this_00;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  *this_01;
  mapped_type mVar1;
  undefined1 auVar2 [16];
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  World *pWVar5;
  Actor *pAVar6;
  GameMode *this_02;
  TaskDatabase *pTVar7;
  mapped_type *this_03;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar8;
  Vector3 VVar9;
  key_type local_54;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  key_type local_2c;
  
  this_00 = &this->state;
  local_54 = PlayerIdentified;
  local_50 = dt;
  pmVar3 = std::
           map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                         *)this_00,&local_54);
  mVar1 = *pmVar3;
  sense(this);
  perceiveVisual(this);
  perceiveAuditory(this);
  purgeMemoryOfIgnoredActors(this);
  produceFacts(this);
  tickEmotionalState(this,local_50);
  VVar9 = Actor::GetActorLocation((this->super_Component).owner);
  local_4c = VVar9.z;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = VVar9._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  this_01 = &(this->state).current.vectors;
  local_54 = CurrentPosition;
  pmVar4 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](this_01,&local_54);
  auVar2 = local_48;
  pmVar4->x = (float)local_48._0_4_;
  pmVar4->y = (float)local_48._4_4_;
  pmVar4->z = local_4c;
  local_48 = auVar2;
  VVar9 = Actor::GetActorLocation((this->super_Component).owner);
  fVar8 = VVar9.z;
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = VVar9._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  local_54 = CurrentPosition_Feet;
  local_4c = fVar8;
  pmVar4 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](this_01,&local_54);
  auVar2 = local_48;
  pmVar4->x = (float)local_48._0_4_;
  pmVar4->y = (float)local_48._4_4_;
  pmVar4->z = local_4c;
  local_48 = auVar2;
  pWVar5 = Component::getWorld(&this->super_Component);
  pAVar6 = GameplayStatics::GetPlayerCharacter(pWVar5,0);
  if (pAVar6 != (Actor *)0x0) {
    local_54 = PlayerIdentified;
    pmVar3 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)this_00,&local_54);
    if (*pmVar3 == true) {
      local_54 = PlayerPosition;
      std::
      map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
      ::operator[](this_01,&local_54);
      VVar9.y = (float)extraout_XMM0_Db;
      VVar9.x = (float)extraout_XMM0_Da;
      VVar9.z = fVar8;
      WorldState::produceFactVector(this_00,Player_LastKnownLocation,VVar9);
    }
  }
  decide(this);
  performTask(this,local_50);
  pWVar5 = Component::getWorld(&this->super_Component);
  this_02 = World::getAuthGameMode(pWVar5);
  pTVar7 = GameMode::getAvailableTasks(this_02);
  evaluatePlan(&(this->planner).plan,this_00,&this->worldQuerySystem,&(this->planner).parameters,
               &pTVar7->satisfiablePredicates);
  if (this->isBeingDebugViewed == true) {
    updateHUD_PlanPath(this);
  }
  local_54 = PlayerIdentified;
  this_03 = std::
            map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
            ::operator[](&(this->state).valueTrackers,&local_54);
  local_2c = PlayerIdentified;
  pmVar3 = std::
           map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                         *)this_00,&local_2c);
  ValueOverTimeTracker::update(this_03,(float)(int)*pmVar3,local_50);
  if (mVar1 == false) {
    local_54 = PlayerIdentified;
    pmVar3 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)this_00,&local_54);
    if (*pmVar3 == true) {
      WorldState::produceFactFlag(this_00,PlayerRecentlyIdentified,true);
    }
  }
  Barker::update(&this->barker,local_50);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::fixedTick(float dt)
{
	auto playerIdentified = state.current.flags[WorldStateIdentifier::PlayerIdentified];

	sense();
	perceive();
	purgeMemoryOfIgnoredActors();
	produceFacts();

	tickEmotionalState(dt);

	Math::Vector3 eyePosition;
	//FRotator rotation;
	//AIOwner->GetCharacter()->GetActorEyesViewPoint(eyePosition, rotation);	
	state.current.vectors[WorldStateIdentifier::CurrentPosition] = owner->GetActorLocation(); //eyePosition;

	state.current.vectors[WorldStateIdentifier::CurrentPosition_Feet] = owner->GetActorLocation();
	//state.current.vectors[WorldStateIdentifier::CurrentPosition_Feet].z -= Cast<AAICharacter>(AIOwner->GetPawn())->GetCapsuleComponent()->GetScaledCapsuleHalfHeight();

	auto player = GameplayStatics::GetPlayerCharacter(getWorld(), 0);
	if (player != nullptr)
	{
		//player->GetActorEyesViewPoint(eyePosition, rotation);

		if (state.current.flags[WorldStateIdentifier::PlayerIdentified])
		{
			state.current.vectors[WorldStateIdentifier::PlayerPosition] = eyePosition;
			state.produceFactVector(ConsumableFact::Player_LastKnownLocation, eyePosition);	
		}
	}	

	decide();
	performTask(dt);

	auto gameMode = getWorld()->getAuthGameMode();
	auto& tasks = gameMode->getAvailableTasks();
	
	evaluatePlan(planner.plan, state, worldQuerySystem, planner.parameters, tasks.satisfiablePredicates);		

	if (isBeingDebugViewed)
	{
		updateHUD_PlanPath();	
	}	

	state.valueTrackers[WorldStateIdentifier::PlayerIdentified].update(state.current.flags[WorldStateIdentifier::PlayerIdentified], dt);
	if (!playerIdentified && state.current.flags[WorldStateIdentifier::PlayerIdentified])
	{
		state.produceFactFlag(ConsumableFact::PlayerRecentlyIdentified, true);
	}

	barker.update(dt);
}